

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

void __thiscall spvtools::opt::UpgradeMemoryModel::UpgradeBarriers(UpgradeMemoryModel *this)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> __l;
  uint64_t type;
  Instruction *this_00;
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  reference ppIVar4;
  DefUseManager *this_01;
  TypeManager *this_02;
  ConstantManager *pCVar5;
  Constant *pCVar6;
  Instruction *this_03;
  uint32_t local_194;
  iterator local_190;
  undefined8 local_188;
  SmallVector<unsigned_int,_2UL> local_180;
  allocator<unsigned_int> local_155;
  uint local_154;
  iterator local_150;
  size_type local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  Constant *local_128;
  Constant *constant;
  uint64_t semantics_value;
  Type *semantics_type;
  Instruction *semantics_inst;
  Instruction *pIStack_100;
  uint32_t semantics_id;
  Instruction *barrier;
  iterator __end5;
  iterator __begin5;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range5;
  Instruction *local_d8;
  Instruction *e;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  undefined1 local_48 [8];
  ProcessFunction CollectBarriers;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> barriers;
  UpgradeMemoryModel *this_local;
  
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &CollectBarriers._M_invoker);
  roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::UpgradeMemoryModel::UpgradeBarriers()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_48,
             (anon_class_16_2_cb54f9d7 *)
             &roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)&__range2)
  ;
  Pass::get_module(&this->super_Pass);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&e);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&e), bVar1) {
    local_d8 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    uVar2 = Instruction::GetSingleWordInOperand(local_d8,0);
    if (uVar2 == 1) {
      __range5._4_4_ = Instruction::GetSingleWordInOperand(local_d8,1);
      std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &__range2,(value_type *)((long)&__range5 + 4));
      pIVar3 = Pass::context(&this->super_Pass);
      bVar1 = IRContext::ProcessCallTreeFromRoots
                        (pIVar3,(ProcessFunction *)local_48,
                         (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&__range2);
      if (bVar1) {
        __end5 = std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)&CollectBarriers._M_invoker);
        barrier = (Instruction *)
                  std::
                  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&CollectBarriers._M_invoker);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                           *)&barrier), bVar1) {
          ppIVar4 = __gnu_cxx::
                    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                    ::operator*(&__end5);
          pIStack_100 = *ppIVar4;
          semantics_inst._4_4_ = Instruction::GetSingleWordInOperand(pIStack_100,2);
          pIVar3 = Pass::context(&this->super_Pass);
          this_01 = IRContext::get_def_use_mgr(pIVar3);
          semantics_type = (Type *)analysis::DefUseManager::GetDef(this_01,semantics_inst._4_4_);
          pIVar3 = Pass::context(&this->super_Pass);
          this_02 = IRContext::get_type_mgr(pIVar3);
          uVar2 = Instruction::type_id((Instruction *)semantics_type);
          semantics_value = (uint64_t)analysis::TypeManager::GetType(this_02,uVar2);
          constant = (Constant *)GetIndexValue(this,(Instruction *)semantics_type);
          pIVar3 = Pass::context(&this->super_Pass);
          pCVar5 = IRContext::get_constant_mgr(pIVar3);
          type = semantics_value;
          local_154 = (uint)constant | 0x1000;
          local_150 = &local_154;
          local_148 = 1;
          std::allocator<unsigned_int>::allocator(&local_155);
          __l._M_len = local_148;
          __l._M_array = local_150;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_140,__l,&local_155);
          pCVar6 = analysis::ConstantManager::GetConstant(pCVar5,(Type *)type,&local_140);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_140);
          std::allocator<unsigned_int>::~allocator(&local_155);
          this_00 = pIStack_100;
          local_128 = pCVar6;
          pIVar3 = Pass::context(&this->super_Pass);
          pCVar5 = IRContext::get_constant_mgr(pIVar3);
          this_03 = analysis::ConstantManager::GetDefiningInstruction
                              (pCVar5,local_128,0,(inst_iterator *)0x0);
          local_194 = Instruction::result_id(this_03);
          local_190 = &local_194;
          local_188 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_190;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list);
          Instruction::SetInOperand(this_00,2,&local_180);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
          __gnu_cxx::
          __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          ::operator++(&__end5);
        }
      }
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      clear((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &CollectBarriers._M_invoker);
    }
    InstructionList::iterator::operator++(&__end2);
  }
  std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~queue
            ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &__range2);
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_48);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &CollectBarriers._M_invoker);
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeBarriers() {
  std::vector<Instruction*> barriers;
  // Collects all the control barriers in |function|. Returns true if the
  // function operates on the Output storage class.
  ProcessFunction CollectBarriers = [this, &barriers](Function* function) {
    bool operates_on_output = false;
    for (auto& block : *function) {
      block.ForEachInst([this, &barriers,
                         &operates_on_output](Instruction* inst) {
        if (inst->opcode() == spv::Op::OpControlBarrier) {
          barriers.push_back(inst);
        } else if (!operates_on_output) {
          // This instruction operates on output storage class if it is a
          // pointer to output type or any input operand is a pointer to output
          // type.
          analysis::Type* type =
              context()->get_type_mgr()->GetType(inst->type_id());
          if (type && type->AsPointer() &&
              type->AsPointer()->storage_class() == spv::StorageClass::Output) {
            operates_on_output = true;
            return;
          }
          inst->ForEachInId([this, &operates_on_output](uint32_t* id_ptr) {
            Instruction* op_inst =
                context()->get_def_use_mgr()->GetDef(*id_ptr);
            analysis::Type* op_type =
                context()->get_type_mgr()->GetType(op_inst->type_id());
            if (op_type && op_type->AsPointer() &&
                op_type->AsPointer()->storage_class() ==
                    spv::StorageClass::Output)
              operates_on_output = true;
          });
        }
      });
    }
    return operates_on_output;
  };

  std::queue<uint32_t> roots;
  for (auto& e : get_module()->entry_points())
    if (spv::ExecutionModel(e.GetSingleWordInOperand(0u)) ==
        spv::ExecutionModel::TessellationControl) {
      roots.push(e.GetSingleWordInOperand(1u));
      if (context()->ProcessCallTreeFromRoots(CollectBarriers, &roots)) {
        for (auto barrier : barriers) {
          // Add OutputMemoryKHR to the semantics of the barriers.
          uint32_t semantics_id = barrier->GetSingleWordInOperand(2u);
          Instruction* semantics_inst =
              context()->get_def_use_mgr()->GetDef(semantics_id);
          analysis::Type* semantics_type =
              context()->get_type_mgr()->GetType(semantics_inst->type_id());
          uint64_t semantics_value = GetIndexValue(semantics_inst);
          const analysis::Constant* constant =
              context()->get_constant_mgr()->GetConstant(
                  semantics_type,
                  {static_cast<uint32_t>(semantics_value) |
                   uint32_t(spv::MemorySemanticsMask::OutputMemoryKHR)});
          barrier->SetInOperand(2u, {context()
                                         ->get_constant_mgr()
                                         ->GetDefiningInstruction(constant)
                                         ->result_id()});
        }
      }
      barriers.clear();
    }
}